

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.cpp
# Opt level: O1

void vera::cullingMode(CullingMode _mode)

{
  undefined8 uVar1;
  
  if (_mode == CULL_NONE) {
    glDisable(0xb44);
    return;
  }
  glEnable(0xb44);
  if (_mode == CULL_BOTH) {
    uVar1 = 0x408;
  }
  else if (_mode == CULL_BACK) {
    uVar1 = 0x405;
  }
  else {
    if (_mode != CULL_FRONT) {
      return;
    }
    uVar1 = 0x404;
  }
  glCullFace(uVar1);
  return;
}

Assistant:

void cullingMode( CullingMode _mode ) {
    if (_mode == CULL_NONE) {
        glDisable(GL_CULL_FACE);
    }
    else {
        glEnable(GL_CULL_FACE);

        if (_mode == CULL_FRONT) 
            glCullFace(GL_FRONT);
        
        else if (_mode == CULL_BACK)
            glCullFace(GL_BACK);
        
        else if (_mode == CULL_BOTH)
            glCullFace(GL_FRONT_AND_BACK);
    }
}